

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O3

Vec_Ptr_t * Aig_ManCofactorBdds(Aig_Man_t *p,Vec_Ptr_t *vSubset,DdManager *dd,DdNode *bFunc)

{
  DdNode **pbVars;
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong local_50;
  
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 100;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  pVVar1->pArray = ppvVar2;
  iVar5 = vSubset->nSize;
  if (iVar5 != 0x1f) {
    pbVars = (DdNode **)vSubset->pArray;
    local_50 = 100;
    lVar4 = 0;
    do {
      n = Extra_bddBitsToCube(dd,(int)lVar4,iVar5,pbVars,1);
      Cudd_Ref(n);
      n_00 = Cudd_Cofactor(dd,bFunc,n);
      Cudd_Ref(n_00);
      n_01 = Cudd_bddAnd(dd,n_00,n);
      Cudd_Ref(n_01);
      Cudd_RecursiveDeref(dd,n_00);
      Cudd_RecursiveDeref(dd,n);
      iVar5 = (int)local_50;
      if ((int)lVar4 == iVar5) {
        if (iVar5 < 0x10) {
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc(0x80);
          }
          else {
            ppvVar2 = (void **)realloc(pVVar1->pArray,0x80);
          }
          pVVar1->pArray = ppvVar2;
          pVVar1->nCap = 0x10;
          local_50 = 0x10;
        }
        else {
          local_50 = (ulong)(uint)(iVar5 * 2);
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc(local_50 * 8);
          }
          else {
            ppvVar2 = (void **)realloc(pVVar1->pArray,local_50 * 8);
          }
          pVVar1->pArray = ppvVar2;
          pVVar1->nCap = iVar5 * 2;
        }
      }
      else {
        ppvVar2 = pVVar1->pArray;
      }
      iVar3 = (int)(lVar4 + 1);
      pVVar1->nSize = iVar3;
      ppvVar2[lVar4] = n_01;
      iVar5 = vSubset->nSize;
      lVar4 = lVar4 + 1;
    } while (iVar3 < 1 << ((byte)iVar5 & 0x1f));
  }
  return pVVar1;
}

Assistant:

Vec_Ptr_t * Aig_ManCofactorBdds( Aig_Man_t * p, Vec_Ptr_t * vSubset, DdManager * dd, DdNode * bFunc )
{
    Vec_Ptr_t * vCofs;
    DdNode * bCube, * bTemp, * bCof, ** pbVars;
    int i;
    vCofs = Vec_PtrAlloc( 100 );
    pbVars = (DdNode **)Vec_PtrArray(vSubset);
    for ( i = 0; i < (1 << Vec_PtrSize(vSubset)); i++ )
    {
        bCube = Extra_bddBitsToCube( dd, i, Vec_PtrSize(vSubset), pbVars, 1 );  Cudd_Ref( bCube );
        bCof  = Cudd_Cofactor( dd, bFunc, bCube );        Cudd_Ref( bCof );
        bCof  = Cudd_bddAnd( dd, bTemp = bCof, bCube );   Cudd_Ref( bCof );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
        Vec_PtrPush( vCofs, bCof );
    }
    return vCofs;
}